

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

QPDF_ERROR_CODE qpdf_read(qpdf_data qpdf,char *filename,char *password)

{
  QPDF_ERROR_CODE QVar1;
  function<void_(_qpdf_data_*)> local_28;
  
  qpdf->filename = filename;
  qpdf->password = password;
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28.super__Function_base._M_functor._M_unused._M_object = call_read;
  local_28._M_invoker =
       std::_Function_handler<void_(_qpdf_data_*),_void_(*)(_qpdf_data_*)>::_M_invoke;
  local_28.super__Function_base._M_manager =
       std::_Function_handler<void_(_qpdf_data_*),_void_(*)(_qpdf_data_*)>::_M_manager;
  QVar1 = trap_errors(qpdf,&local_28);
  if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_28.super__Function_base._M_manager)
              ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_read(qpdf_data qpdf, char const* filename, char const* password)
{
    QPDF_ERROR_CODE status = QPDF_SUCCESS;
    qpdf->filename = filename;
    qpdf->password = password;
    status = trap_errors(qpdf, &call_read);
    // We no longer have a good way to exercise a file with both warnings and errors because qpdf is
    // getting much better at recovering.
    QTC::TC(
        "qpdf",
        "qpdf-c called qpdf_read",
        (status == 0)                  ? 0
            : (status & QPDF_WARNINGS) ? 1
            : (status & QPDF_ERRORS)   ? 2
                                       : -1);
    return status;
}